

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nametoaddr.c
# Opt level: O0

u_char * pcap_ether_aton(char *s)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  byte *pbVar4;
  byte local_2c;
  u_int d;
  u_char *e;
  u_char *ep;
  char *s_local;
  
  s_local = (char *)malloc(6);
  e = (u_char *)s_local;
  ep = (u_char *)s;
  if ((u_char *)s_local == (u_char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    while (*ep != '\0') {
      if (((*ep == ':') || (*ep == '.')) || (*ep == '-')) {
        ep = ep + 1;
      }
      pbVar4 = ep + 1;
      iVar1 = xdtoi((int)(char)*ep);
      local_2c = (byte)iVar1;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)*pbVar4] & 0x1000) != 0) {
        iVar2 = xdtoi((int)(char)*pbVar4);
        local_2c = (byte)iVar2 | (byte)(iVar1 << 4);
        pbVar4 = ep + 2;
      }
      ep = pbVar4;
      *e = local_2c;
      e = e + 1;
    }
  }
  return (u_char *)s_local;
}

Assistant:

u_char *
pcap_ether_aton(const char *s)
{
	register u_char *ep, *e;
	register u_int d;

	e = ep = (u_char *)malloc(6);
	if (e == NULL)
		return (NULL);

	while (*s) {
		if (*s == ':' || *s == '.' || *s == '-')
			s += 1;
		d = xdtoi(*s++);
		if (isxdigit((unsigned char)*s)) {
			d <<= 4;
			d |= xdtoi(*s++);
		}
		*ep++ = d;
	}

	return (e);
}